

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O2

normal3f tinyusdz::transform(matrix4d *m,normal3f *p)

{
  double dVar1;
  double dVar2;
  double dVar3;
  normal3f nVar4;
  normal3f nVar5;
  
  dVar1 = m->m[3][2];
  dVar2 = m->m[3][0];
  dVar3 = m->m[3][1];
  nVar4 = value::MultV<tinyusdz::value::matrix4d,tinyusdz::value::normal3f,double,float,3ul>(m,p);
  nVar5.x = nVar4.x + (float)dVar2;
  nVar5.y = nVar4.y + (float)dVar3;
  nVar5.z = nVar4.z + (float)dVar1;
  return nVar5;
}

Assistant:

value::normal3f transform(const value::matrix4d &m, const value::normal3f &p) {
  value::normal3f tx{float(m.m[3][0]), float(m.m[3][1]), float(m.m[3][2])};
  return value::MultV<value::matrix4d, value::normal3f, double, float, 3>(m, p) + tx;
}